

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestStreamingImpl::doStreamJ(TestStreamingImpl *this,DoStreamJContext context)

{
  int *piVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  SegmentReader *pSVar4;
  WeakFulfiller<void> *params;
  undefined8 *in_RDX;
  int iVar5;
  Fault f;
  StructReader local_a8;
  PointerReader local_78;
  Exception *local_50;
  CapTableReader *pCStack_48;
  WirePointer *local_40;
  int iStack_38;
  undefined4 uStack_34;
  
  (**(code **)*in_RDX)(&local_50);
  local_78.pointer = local_40;
  local_78.nestingLimit = iStack_38;
  local_78._28_4_ = uStack_34;
  local_78.segment = (SegmentReader *)local_50;
  local_78.capTable = pCStack_48;
  iVar5 = 0;
  PointerReader::getStruct(&local_a8,&local_78,(word *)0x0);
  if (0x1f < local_a8.dataSize) {
    iVar5 = *local_a8.data;
  }
  piVar1 = (int *)((long)&context.hook[1]._vptr_CallContextHook + 4);
  *piVar1 = *piVar1 + iVar5;
  if (*(char *)&context.hook[4]._vptr_CallContextHook == '\x01') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              ((Fault *)&local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
               ,0x161,FAILED,(char *)0x0,"\"throw requested\"",(char (*) [16])"throw requested");
    kj::_::Debug::Fault::~Fault((Fault *)&local_a8);
    kj::_::readyNow();
  }
  else {
    params = (WeakFulfiller<void> *)operator_new(0x18);
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
         (_func_int **)&PTR_reject_006b66f0;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_006b6728;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
              ((PromiseDisposer *)&local_78,params);
    pSVar4 = local_78.segment;
    local_a8.segment = local_78.segment;
    local_a8.data = (void *)0x0;
    pp_Var2 = context.hook[2]._vptr_CallContextHook;
    pp_Var3 = context.hook[3]._vptr_CallContextHook;
    context.hook[2]._vptr_CallContextHook = (_func_int **)&params->super_WeakFulfillerBase;
    context.hook[3]._vptr_CallContextHook = (_func_int **)params;
    if (pp_Var3 != (_func_int **)0x0) {
      local_a8.capTable = (CapTableReader *)&params->super_WeakFulfillerBase;
      (**(code **)*pp_Var2)(pp_Var2,(long)pp_Var3 + *(long *)(*pp_Var3 + -0x10));
    }
    (this->super_Server)._vptr_Server = (_func_int **)pSVar4;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> doStreamJ(DoStreamJContext context) override {
    jSum += context.getParams().getJ();

    if (jShouldThrow) {
      KJ_FAIL_ASSERT("throw requested") { break; }
      return kj::READY_NOW;
    }

    auto paf = kj::newPromiseAndFulfiller<void>();
    fulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }